

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O1

void __thiscall
SQCompilation::CodegenVisitor::visitTryStatement(CodegenVisitor *this,TryStatement *tryStmt)

{
  SQUnsignedInteger *pSVar1;
  SQScope *pSVar2;
  SQInteger *pSVar3;
  long *plVar4;
  size_type sVar5;
  uint uVar6;
  SQFuncState *pSVar7;
  SQObjectPtr *pSVar8;
  long lVar9;
  SQObject SVar10;
  SQInteger SVar11;
  SQObjectPtr *pSVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  ulong pos;
  ulong uVar16;
  SQScope __oldscope__;
  undefined1 local_58 [8];
  SQInteger SStack_50;
  SQInstruction local_48;
  SQInstruction SStack_40;
  SQInstruction *local_38;
  
  lVar13 = (long)(tryStmt->super_Statement).super_Node._coordinates.lineStart;
  if (lVar13 != -1) {
    SQFuncState::AddLineInfos(this->_fs,lVar13,this->_lineinfo,false);
  }
  local_48.field_0 = (anon_union_4_2_91d81cc7_for_SQInstruction_0)0x0;
  local_48.op = 'B';
  local_48._arg0 = '\0';
  local_48._arg2 = '\0';
  local_48._arg3 = '\0';
  SQFuncState::AddInstruction(this->_fs,&local_48);
  pSVar7 = this->_fs;
  pSVar7->_traps = pSVar7->_traps + 1;
  sVar5 = (pSVar7->_breaktargets)._size;
  if (sVar5 != 0) {
    plVar4 = (pSVar7->_breaktargets)._vals + (sVar5 - 1);
    *plVar4 = *plVar4 + 1;
  }
  sVar5 = (pSVar7->_continuetargets)._size;
  if (sVar5 != 0) {
    plVar4 = (pSVar7->_continuetargets)._vals + (sVar5 - 1);
    *plVar4 = *plVar4 + 1;
  }
  sVar5 = (pSVar7->_instructions)._size;
  local_48 = (SQInstruction)(this->_scope).outers;
  SStack_40 = (SQInstruction)(this->_scope).stacksize;
  (this->_scope).outers = pSVar7->_outers;
  SVar11 = SQFuncState::GetStackSize(pSVar7);
  (this->_scope).stacksize = SVar11;
  _local_58 = (SQObject)ZEXT816(0);
  local_58._0_4_ = OT_NULL;
  uVar14 = (this->_scopedconsts)._size;
  uVar6 = (this->_scopedconsts)._allocated;
  if (uVar6 <= uVar14) {
    uVar14 = uVar14 * 2;
    uVar15 = 4;
    if (uVar14 != 0) {
      uVar15 = (ulong)uVar14;
    }
    pSVar12 = (SQObjectPtr *)
              sq_vm_realloc((this->_scopedconsts)._alloc_ctx,(this->_scopedconsts)._vals,
                            (ulong)uVar6 << 4,uVar15 << 4);
    (this->_scopedconsts)._vals = pSVar12;
    (this->_scopedconsts)._allocated = (size_type)uVar15;
  }
  SVar10 = _local_58;
  pSVar8 = (this->_scopedconsts)._vals;
  uVar14 = (this->_scopedconsts)._size;
  (this->_scopedconsts)._size = uVar14 + 1;
  pSVar12 = pSVar8 + uVar14;
  (pSVar12->super_SQObject)._type = local_58._0_4_;
  (pSVar12->super_SQObject)._flags = local_58[4];
  *(undefined3 *)&(pSVar12->super_SQObject).field_0x5 = local_58._5_3_;
  (pSVar12->super_SQObject)._unVal.nInteger = SStack_50;
  if ((pSVar8[uVar14].super_SQObject._type & 0x8000000) != 0) {
    pSVar1 = &((pSVar8[uVar14].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
              .super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  pSVar2 = &this->_scope;
  _local_58 = SVar10;
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_58);
  Node::visit<SQCompilation::CodegenVisitor>(&tryStmt->_tryStmt->super_Node,this);
  lVar13 = this->_fs->_outers;
  SVar11 = SQFuncState::GetStackSize(this->_fs);
  lVar9 = (this->_scope).stacksize;
  if (SVar11 != lVar9) {
    SQFuncState::SetStackSize(this->_fs,lVar9);
    if (lVar13 != this->_fs->_outers) {
      local_58._4_4_ = 0x47;
      local_58._0_4_ = *(anon_union_4_2_91d81cc7_for_SQInstruction_0 *)&(this->_scope).stacksize;
      SQFuncState::AddInstruction(this->_fs,(SQInstruction *)local_58);
    }
  }
  uVar15 = (ulong)(sVar5 - 1);
  pSVar2->outers = (SQInteger)local_48;
  (this->_scope).stacksize = (SQInteger)SStack_40;
  uVar14 = (this->_scopedconsts)._size - 1;
  (this->_scopedconsts)._size = uVar14;
  SQObjectPtr::~SQObjectPtr((this->_scopedconsts)._vals + uVar14);
  pSVar7 = this->_fs;
  pSVar3 = &pSVar7->_traps;
  *pSVar3 = *pSVar3 + -1;
  local_48.field_0 = (anon_union_4_2_91d81cc7_for_SQInstruction_0)0x0;
  local_48.op = 'C';
  local_48._arg0 = '\x01';
  local_48._arg2 = '\0';
  local_48._arg3 = '\0';
  SQFuncState::AddInstruction(pSVar7,&local_48);
  pSVar7 = this->_fs;
  sVar5 = (pSVar7->_breaktargets)._size;
  if (sVar5 != 0) {
    plVar4 = (pSVar7->_breaktargets)._vals + (sVar5 - 1);
    *plVar4 = *plVar4 + -1;
  }
  sVar5 = (pSVar7->_continuetargets)._size;
  if (sVar5 != 0) {
    plVar4 = (pSVar7->_continuetargets)._vals + (sVar5 - 1);
    *plVar4 = *plVar4 + -1;
  }
  local_48.field_0 = (anon_union_4_2_91d81cc7_for_SQInstruction_0)0x0;
  local_48.op = '\"';
  local_48._arg0 = '\0';
  local_48._arg2 = '\0';
  local_48._arg3 = '\0';
  SQFuncState::AddInstruction(pSVar7,&local_48);
  pos = (ulong)((this->_fs->_instructions)._size - 1);
  SQFuncState::SetInstructionParam(this->_fs,uVar15,1,pos - uVar15);
  local_48 = (SQInstruction)pSVar2->outers;
  SStack_40 = (SQInstruction)(this->_scope).stacksize;
  pSVar7 = this->_fs;
  (this->_scope).outers = pSVar7->_outers;
  SVar11 = SQFuncState::GetStackSize(pSVar7);
  (this->_scope).stacksize = SVar11;
  stack0xffffffffffffffac = ZEXT412(0);
  local_58._0_4_ = OT_NULL;
  uVar14 = (this->_scopedconsts)._size;
  uVar6 = (this->_scopedconsts)._allocated;
  if (uVar6 <= uVar14) {
    uVar14 = uVar14 * 2;
    uVar16 = 4;
    if (uVar14 != 0) {
      uVar16 = (ulong)uVar14;
    }
    pSVar12 = (SQObjectPtr *)
              sq_vm_realloc((this->_scopedconsts)._alloc_ctx,(this->_scopedconsts)._vals,
                            (ulong)uVar6 << 4,uVar16 << 4);
    (this->_scopedconsts)._vals = pSVar12;
    (this->_scopedconsts)._allocated = (size_type)uVar16;
  }
  SVar10 = _local_58;
  pSVar8 = (this->_scopedconsts)._vals;
  uVar14 = (this->_scopedconsts)._size;
  (this->_scopedconsts)._size = uVar14 + 1;
  pSVar12 = pSVar8 + uVar14;
  (pSVar12->super_SQObject)._type = local_58._0_4_;
  (pSVar12->super_SQObject)._flags = local_58[4];
  *(undefined3 *)&(pSVar12->super_SQObject).field_0x5 = local_58._5_3_;
  (pSVar12->super_SQObject)._unVal.nInteger = SStack_50;
  if ((pSVar8[uVar14].super_SQObject._type & 0x8000000) != 0) {
    pSVar1 = &((pSVar8[uVar14].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
              .super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  _local_58 = SVar10;
  local_38 = (SQInstruction *)pSVar2;
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_58);
  pSVar7 = this->_fs;
  _local_58 = SQFuncState::CreateString(pSVar7,tryStmt->_exception->_id,-1);
  SVar11 = SQFuncState::PushLocalVariable(pSVar7,(SQObject *)local_58,false);
  SQFuncState::SetInstructionParam(this->_fs,uVar15,0,SVar11);
  Node::visit<SQCompilation::CodegenVisitor>(&tryStmt->_catchStmt->super_Node,this);
  SQFuncState::SetInstructionParams
            (this->_fs,pos,0,((this->_fs->_instructions)._size - 1) - pos,0,0);
  lVar13 = this->_fs->_outers;
  SVar11 = SQFuncState::GetStackSize(this->_fs);
  lVar9 = (this->_scope).stacksize;
  if (SVar11 != lVar9) {
    SQFuncState::SetStackSize(this->_fs,lVar9);
    if (lVar13 != this->_fs->_outers) {
      local_58._4_4_ = 0x47;
      local_58._0_4_ = *(anon_union_4_2_91d81cc7_for_SQInstruction_0 *)&(this->_scope).stacksize;
      SQFuncState::AddInstruction(this->_fs,(SQInstruction *)local_58);
    }
  }
  *local_38 = local_48;
  local_38[1] = SStack_40;
  uVar14 = (this->_scopedconsts)._size - 1;
  (this->_scopedconsts)._size = uVar14;
  SQObjectPtr::~SQObjectPtr((this->_scopedconsts)._vals + uVar14);
  return;
}

Assistant:

void CodegenVisitor::visitTryStatement(TryStatement *tryStmt) {
    addLineNumber(tryStmt);
    _fs->AddInstruction(_OP_PUSHTRAP, 0, 0);
    _fs->_traps++;

    if (_fs->_breaktargets.size()) _fs->_breaktargets.top()++;
    if (_fs->_continuetargets.size()) _fs->_continuetargets.top()++;

    SQInteger trappos = _fs->GetCurrentPos();
    {
        BEGIN_SCOPE();
        tryStmt->tryStatement()->visit(this);
        END_SCOPE();
    }

    _fs->_traps--;
    _fs->AddInstruction(_OP_POPTRAP, 1, 0);
    if (_fs->_breaktargets.size()) _fs->_breaktargets.top()--;
    if (_fs->_continuetargets.size()) _fs->_continuetargets.top()--;
    _fs->AddInstruction(_OP_JMP, 0, 0);
    SQInteger jmppos = _fs->GetCurrentPos();
    _fs->SetInstructionParam(trappos, 1, (_fs->GetCurrentPos() - trappos));

    {
        BEGIN_SCOPE();
        SQInteger ex_target = _fs->PushLocalVariable(_fs->CreateString(tryStmt->exceptionId()->id()), false);
        _fs->SetInstructionParam(trappos, 0, ex_target);
        tryStmt->catchStatement()->visit(this);
        _fs->SetInstructionParams(jmppos, 0, (_fs->GetCurrentPos() - jmppos), 0);
        END_SCOPE();
    }
}